

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O2

void __thiscall Infector::Container::bindSingleAsNothing<BGVS>(Container *this)

{
  long lVar1;
  mapped_type *pmVar2;
  iterator iVar3;
  AnyShared<BGVS> *this_00;
  mapped_type *ppIVar4;
  key_type local_30;
  
  must_not_have<BGVS>(this);
  local_30._M_target = (type_info *)&BGVS::typeinfo;
  pmVar2 = std::__detail::
           _Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->typeMap,&local_30);
  (pmVar2->type)._M_target = (type_info *)&BGVS::typeinfo;
  pmVar2->single = true;
  local_30._M_target = (type_info *)&BGVS::typeinfo;
  iVar3 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_30);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    this_00 = (AnyShared<BGVS> *)operator_new(0x58);
    *(undefined8 *)&(this_00->multi_solver)._M_h._M_rehash_policy = 0;
    (this_00->multi_solver)._M_h._M_rehash_policy._M_next_resize = 0;
    (this_00->multi_solver)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (this_00->multi_solver)._M_h._M_element_count = 0;
    (this_00->multi_solver)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this_00->multi_solver)._M_h._M_bucket_count = 0;
    (this_00->ist).super___shared_ptr<BGVS,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    (this_00->ist).super___shared_ptr<BGVS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)this_00 = 0;
    *(undefined8 *)&this_00->a = 0;
    (this_00->multi_solver)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    AnyShared<BGVS>::AnyShared(this_00);
    lVar1 = *(long *)(*(long *)this_00 + -0x38);
    local_30._M_target = (type_info *)&BGVS::typeinfo;
    ppIVar4 = std::__detail::
              _Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,&local_30);
    *ppIVar4 = (mapped_type)(&this_00->field_0x0 + lVar1);
  }
  return;
}

Assistant:

void Container::bindSingleAsNothing(){
        bool tests = reduced_type_tests<T>();
        (void) tests; //fix unused variable warning
        must_not_have<T>();

        typeMap[std::type_index(typeid(T))]
                = Binding(std::type_index(typeid(T)), true);

        try{
            if(singleIstances.find( std::type_index(typeid(T)) )
                                    ==singleIstances.end())
                singleIstances[std::type_index(typeid(T))]
                                = new AnyShared<T>();
        }catch(std::exception & ex){
            auto it2 = typeMap.find( std::type_index(typeid(T)) );
            typeMap.erase(it2);
            throw ex;
        }catch(...){
            auto it2 = typeMap.find( std::type_index(typeid(T)) );
            typeMap.erase(it2);
            launch_exception<ExUnkownException>();
        }
    }